

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::BlobProto::BlobProto(BlobProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobProto_0071c200
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->data_).current_size_ = 0;
  (this->data_).total_size_ = 0;
  (this->data_).rep_ = (Rep *)0x0;
  (this->diff_).current_size_ = 0;
  (this->diff_).total_size_ = 0;
  (this->diff_).rep_ = (Rep *)0x0;
  (this->double_data_).current_size_ = 0;
  (this->double_data_).total_size_ = 0;
  (this->double_data_).rep_ = (Rep *)0x0;
  (this->double_diff_).current_size_ = 0;
  (this->double_diff_).total_size_ = 0;
  (this->double_diff_).rep_ = (Rep *)0x0;
  if (this != (BlobProto *)&_BlobProto_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  this->shape_ = (BlobShape *)0x0;
  this->num_ = 0;
  this->channels_ = 0;
  this->height_ = 0;
  this->width_ = 0;
  return;
}

Assistant:

BlobProto::BlobProto()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.BlobProto)
}